

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_aead_ctx.cc
# Opt level: O0

bool __thiscall
bssl::SSLAEADContext::Seal
          (SSLAEADContext *this,uint8_t *out,size_t *out_len,size_t max_out_len,uint8_t type,
          uint16_t record_version,uint64_t seqnum,Span<const_unsigned_char> header,uint8_t *in,
          size_t in_len)

{
  bool bVar1;
  size_t local_58;
  size_t suffix_len;
  size_t prefix_len;
  uint16_t record_version_local;
  size_t sStack_40;
  uint8_t type_local;
  size_t max_out_len_local;
  size_t *out_len_local;
  uint8_t *out_local;
  SSLAEADContext *this_local;
  
  prefix_len._4_2_ = record_version;
  prefix_len._7_1_ = type;
  sStack_40 = max_out_len;
  max_out_len_local = (size_t)out_len;
  out_len_local = (size_t *)out;
  out_local = (uint8_t *)this;
  suffix_len = ExplicitNonceLen(this);
  bVar1 = SuffixLen(this,&local_58,in_len,0);
  if (bVar1) {
    if ((in_len + suffix_len < in_len) || (in_len + suffix_len + local_58 < in_len + suffix_len)) {
      ERR_put_error(0x1e,0,200,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                    ,0x18b);
      this_local._7_1_ = false;
    }
    else if (sStack_40 < in_len + suffix_len + local_58) {
      ERR_put_error(0x10,0,0x79,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                    ,399);
      this_local._7_1_ = false;
    }
    else {
      bVar1 = SealScatter(this,(uint8_t *)out_len_local,
                          (uint8_t *)((long)out_len_local + suffix_len),
                          (uint8_t *)((long)out_len_local + in_len + suffix_len),prefix_len._7_1_,
                          prefix_len._4_2_,seqnum,header,in,in_len,(uint8_t *)0x0,0);
      if (bVar1) {
        *(size_t *)max_out_len_local = suffix_len + in_len + local_58;
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    ERR_put_error(0x10,0,200,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                  ,0x186);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SSLAEADContext::Seal(uint8_t *out, size_t *out_len, size_t max_out_len,
                          uint8_t type, uint16_t record_version,
                          uint64_t seqnum, Span<const uint8_t> header,
                          const uint8_t *in, size_t in_len) {
  const size_t prefix_len = ExplicitNonceLen();
  size_t suffix_len;
  if (!SuffixLen(&suffix_len, in_len, 0)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_RECORD_TOO_LARGE);
    return false;
  }
  if (in_len + prefix_len < in_len ||
      in_len + prefix_len + suffix_len < in_len + prefix_len) {
    OPENSSL_PUT_ERROR(CIPHER, SSL_R_RECORD_TOO_LARGE);
    return false;
  }
  if (in_len + prefix_len + suffix_len > max_out_len) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_BUFFER_TOO_SMALL);
    return false;
  }

  if (!SealScatter(out, out + prefix_len, out + prefix_len + in_len, type,
                   record_version, seqnum, header, in, in_len, 0, 0)) {
    return false;
  }
  *out_len = prefix_len + in_len + suffix_len;
  return true;
}